

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port,
                          _Bool blocking)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  curl_socket_t sockfd;
  Curl_easy *data;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  anon_enum_32 aVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  int iVar10;
  CHUNKcode CVar11;
  Curl_send_buffer *buff;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  time_t tVar15;
  ulong timeout_ms;
  undefined8 extraout_RAX;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  char cVar21;
  char *local_a0;
  size_t local_90;
  long local_78;
  int subversion;
  ulong local_60;
  char *local_58;
  ssize_t gotbytes;
  char *local_48;
  long *local_40;
  ssize_t tookcareof;
  
  subversion = 0;
  aVar7 = conn->tunnel_state[sockindex];
  if (aVar7 != TUNNEL_COMPLETE) {
    data = conn->data;
    sockfd = conn->sock[sockindex];
    (conn->bits).proxy_connect_closed = false;
    local_40 = &(data->info).request_size;
    piVar2 = &(data->req).httpcode;
    local_60 = 0;
    bVar5 = false;
    local_78 = 0;
    local_58 = hostname;
LAB_00139827:
    pcVar12 = local_58;
    if (aVar7 == TUNNEL_INIT) {
      Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_58,(ulong)(uint)remote_port);
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      buff = Curl_add_buffer_init();
      CVar9 = CURLE_OUT_OF_MEMORY;
      if (buff == (Curl_send_buffer *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar12 = curl_maprintf("%s:%hu",pcVar12,(ulong)(uint)remote_port);
      if (pcVar12 == (char *)0x0) {
LAB_0013a2b5:
        Curl_add_buffer_free(buff);
        return CVar9;
      }
      CVar8 = Curl_http_output_auth(conn,"CONNECT",pcVar12,true);
      (*Curl_cfree)(pcVar12);
      pcVar12 = local_58;
      if (CVar8 != CURLE_OK) {
        Curl_add_buffer_free(buff);
        return CVar8;
      }
      local_48 = "1.1";
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
        local_48 = "1.0";
      }
      if ((conn->host).name == local_58) {
        cVar21 = (conn->bits).ipv6_ip;
      }
      else {
        pcVar13 = strchr(local_58,0x3a);
        cVar21 = pcVar13 != (char *)0x0;
      }
      pcVar13 = "";
      if (cVar21 != '\0') {
        pcVar13 = "[";
      }
      pcVar16 = "";
      if (cVar21 != '\0') {
        pcVar16 = "]";
      }
      pcVar12 = curl_maprintf("%s%s%s:%hu",pcVar13,pcVar12,pcVar16,(ulong)(uint)remote_port);
      if (pcVar12 == (char *)0x0) goto LAB_0013a2b5;
      pcVar13 = Curl_checkProxyheaders(conn,"Host:");
      if (pcVar13 == (char *)0x0) {
        pcVar13 = curl_maprintf("Host: %s\r\n",pcVar12);
        if (pcVar13 == (char *)0x0) {
          (*Curl_cfree)(pcVar12);
          goto LAB_0013a2b5;
        }
      }
      else {
        pcVar13 = (char *)0x0;
      }
      pcVar16 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
      pcVar17 = "";
      if (pcVar16 == (char *)0x0) {
        pcVar17 = "Proxy-Connection: Keep-Alive\r\n";
      }
      pcVar14 = Curl_checkProxyheaders(conn,"User-Agent:");
      pcVar16 = "";
      if ((pcVar14 == (char *)0x0) && (pcVar16 = "", (data->set).str[0x24] != (char *)0x0)) {
        pcVar16 = (conn->allocptr).uagent;
      }
      pcVar14 = pcVar13;
      if (pcVar13 == (char *)0x0) {
        pcVar14 = "";
      }
      pcVar19 = (conn->allocptr).proxyuserpwd;
      if (pcVar19 == (char *)0x0) {
        pcVar19 = "";
      }
      CVar9 = Curl_add_bufferf(buff,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar12,local_48,pcVar14,
                               pcVar19,pcVar16,pcVar17);
      if (pcVar13 != (char *)0x0) {
        (*Curl_cfree)(pcVar13);
      }
      (*Curl_cfree)(pcVar12);
      if ((((CVar9 != CURLE_OK) ||
           (CVar9 = Curl_add_custom_headers(conn,true,buff), CVar9 != CURLE_OK)) ||
          (CVar9 = Curl_add_bufferf(buff,"\r\n"), CVar9 != CURLE_OK)) ||
         (CVar9 = Curl_add_buffer_send(buff,conn,local_40,0,sockindex), CVar9 != CURLE_OK)) {
        Curl_failf(data,"Failed sending CONNECT to proxy");
        buff = (Curl_send_buffer *)0x0;
        goto LAB_0013a2b5;
      }
      Curl_add_buffer_free((Curl_send_buffer *)0x0);
      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    }
    tVar15 = Curl_timeleft(data,(timeval *)0x0,true);
    if (tVar15 < 1) {
      pcVar12 = "Proxy CONNECT aborted due to timeout";
LAB_0013a0ee:
      Curl_failf(data,pcVar12);
      return CURLE_RECV_ERROR;
    }
    if ((!blocking) && (_Var6 = Curl_conn_data_pending(conn,sockindex), !_Var6)) {
      return CURLE_OK;
    }
    pcVar12 = (data->state).buffer;
    local_90 = 0;
    uVar20 = 1;
    uVar18 = 0;
    local_a0 = pcVar12;
LAB_00139b19:
    iVar10 = Curl_pgrsUpdate(conn);
    if (iVar10 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    if ((data->state).buffer + 0x4000 <= pcVar12) {
      pcVar12 = "CONNECT response too large!";
      goto LAB_0013a0ee;
    }
    timeout_ms = Curl_timeleft(data,(timeval *)0x0,true);
    if ((long)timeout_ms < 1) {
      pcVar12 = "Proxy CONNECT aborted due to timeout";
LAB_0013a11a:
      Curl_failf(data,pcVar12);
      iVar10 = Curl_pgrsUpdate(conn);
      if (iVar10 == 0) {
        return CURLE_RECV_ERROR;
      }
      return CURLE_ABORTED_BY_CALLBACK;
    }
    CVar9 = Curl_read(conn,sockfd,pcVar12,1,&gotbytes);
    if (CVar9 != CURLE_OK) {
      if (CVar9 != CURLE_AGAIN) goto LAB_0013a017;
      if (999 < timeout_ms) {
        timeout_ms = 1000;
      }
      iVar10 = Curl_socket_check(sockfd,-1,-1,timeout_ms);
      if (iVar10 == -1) {
        pcVar12 = "Proxy CONNECT aborted due to select/poll error";
        goto LAB_0013a11a;
      }
LAB_00139fb7:
      if ((0x3fff < uVar18) || (uVar20 == 0)) goto LAB_0013a017;
      goto LAB_00139b19;
    }
    if (0 < gotbytes) {
      if (uVar20 < 2) {
        uVar18 = uVar18 + 1;
        local_90 = (long)(int)local_90 + 1;
        if (*pcVar12 == '\n') {
          if ((data->set).verbose == true) {
            Curl_debug(data,CURLINFO_HEADER_IN,local_a0,local_90,conn);
          }
          CVar9 = Curl_client_write(conn,(data->set).include_header | 2,local_a0,local_90);
          plVar3 = &(data->info).header_size;
          *plVar3 = *plVar3 + local_90;
          plVar3 = &(data->req).headerbytecount;
          *plVar3 = *plVar3 + local_90;
          if (CVar9 != CURLE_OK) {
            return CVar9;
          }
          if ((*local_a0 == '\r') || (*local_a0 == '\n')) {
            pcVar12 = (data->state).buffer;
            uVar20 = 0;
            if (((data->req).httpcode == 0x197) && ((data->state).authproblem == false)) {
              if (local_78 == 0) {
                if ((local_60 & 1) != 0) {
                  Curl_infof(data,"Ignore chunked response-body\n");
                  (data->req).ignorebody = true;
                  if (local_a0[1] == '\n') {
                    local_a0 = local_a0 + 1;
                  }
                  CVar11 = Curl_httpchunk_read(conn,local_a0 + 1,1,&gotbytes);
                  uVar20 = 2;
                  if (CVar11 == CHUNKE_STOP) {
                    uVar20 = 0;
                    Curl_infof(data,"chunk reading DONE\n");
                  }
                }
              }
              else {
                Curl_infof(data,"Ignore %lld bytes of response-body\n");
                uVar20 = 2;
              }
            }
            conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            uVar18 = 0;
            goto LAB_00139fb7;
          }
          local_a0[local_90] = '\0';
          iVar10 = curl_strnequal("WWW-Authenticate:",local_a0,0x11);
          if ((iVar10 == 0) || (*piVar2 != 0x191)) {
            iVar10 = curl_strnequal("Proxy-authenticate:",local_a0,0x13);
            if ((iVar10 != 0) && (_Var6 = true, *piVar2 == 0x197)) goto LAB_00139dcd;
            iVar10 = curl_strnequal("Content-Length:",local_a0,0xf);
            if (iVar10 == 0) {
              _Var6 = Curl_compareheader(local_a0,"Connection:","close");
              if (_Var6) {
LAB_00139eef:
                bVar5 = true;
              }
              else {
                _Var6 = Curl_compareheader(local_a0,"Transfer-Encoding:","chunked");
                if (_Var6) {
                  uVar20 = *piVar2;
                  if (uVar20 - 200 < 100) {
                    pcVar12 = "Transfer-Encoding: in %03d response";
                    goto LAB_0013a2fa;
                  }
                  Curl_infof(data,"CONNECT responded chunked\n");
                  Curl_httpchunk_init(conn);
                  local_60 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                else {
                  _Var6 = Curl_compareheader(local_a0,"Proxy-Connection:","close");
                  if (_Var6) goto LAB_00139eef;
                  iVar10 = __isoc99_sscanf(local_a0,"HTTP/1.%d %d",&subversion,piVar2);
                  if (iVar10 == 2) {
                    (data->info).httpproxycode = (data->req).httpcode;
                  }
                }
              }
            }
            else {
              uVar20 = *piVar2;
              if (uVar20 - 200 < 100) {
                pcVar12 = "Content-Length: in %03d response";
                goto LAB_0013a2fa;
              }
              local_78 = strtol(local_a0 + 0xf,(char **)0x0,10);
            }
          }
          else {
            _Var6 = false;
LAB_00139dcd:
            pcVar12 = Curl_copy_header_value(local_a0);
            if (pcVar12 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            CVar9 = Curl_http_input_auth(conn,_Var6,pcVar12);
            (*Curl_cfree)(pcVar12);
            if (CVar9 != CURLE_OK) {
              return CVar9;
            }
          }
          pcVar12 = (data->state).buffer;
          local_90 = 0;
          local_a0 = pcVar12;
        }
        else {
          pcVar12 = pcVar12 + 1;
        }
        uVar20 = 1;
      }
      else {
        pcVar12 = (data->state).buffer;
        if (local_78 == 0) {
          tookcareof = 0;
          CVar11 = Curl_httpchunk_read(conn,pcVar12,1,&tookcareof);
          uVar20 = 2;
          if (CVar11 == CHUNKE_STOP) {
            uVar20 = 0;
            Curl_infof(data,"chunk reading DONE\n");
            conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          }
          uVar18 = 0;
          local_78 = 0;
          goto LAB_00139fb7;
        }
        lVar1 = local_78 + -1;
        bVar4 = local_78 < 2;
        local_78 = lVar1;
        if (bVar4) goto LAB_0013a017;
        uVar20 = 2;
        uVar18 = 0;
      }
      goto LAB_00139fb7;
    }
    if ((data->set).proxyauth == 0) {
      pcVar12 = "Proxy CONNECT aborted";
      goto LAB_0013a11a;
    }
    if ((data->state).authproxy.avail == 0) {
      pcVar12 = "Proxy CONNECT aborted";
      goto LAB_0013a11a;
    }
    (conn->bits).proxy_connect_closed = true;
    Curl_infof(data,"Proxy CONNECT connection closed\n");
LAB_0013a017:
    iVar10 = Curl_pgrsUpdate(conn);
    if (iVar10 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    if ((data->info).httpproxycode != 200) {
      CVar9 = Curl_http_auth_act(conn);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      if ((conn->bits).close != false) {
        bVar5 = true;
      }
    }
    pcVar12 = (data->req).newurl;
    if (!bVar5) {
      if (pcVar12 == (char *)0x0) goto LAB_0013a1a8;
      aVar7 = conn->tunnel_state[sockindex];
      if (aVar7 == TUNNEL_COMPLETE) {
        conn->tunnel_state[sockindex] = TUNNEL_INIT;
        Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
        if ((data->req).newurl == (char *)0x0) goto LAB_0013a1a8;
        aVar7 = conn->tunnel_state[sockindex];
      }
      goto LAB_00139827;
    }
    if (pcVar12 != (char *)0x0) {
      Curl_closesocket(conn,conn->sock[sockindex]);
      conn->sock[sockindex] = -1;
    }
LAB_0013a1a8:
    if (*piVar2 == 200) {
      conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.done = true;
      Curl_infof(data,"Proxy replied OK to CONNECT request\n");
      (data->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
      return CURLE_OK;
    }
    pcVar12 = (data->req).newurl;
    if ((bool)(bVar5 & pcVar12 != (char *)0x0)) {
      (conn->bits).proxy_connect_closed = true;
      Curl_infof(data,"Connect me again please\n");
    }
    else {
      (*Curl_cfree)(pcVar12);
      (data->req).newurl = (char *)0x0;
      Curl_conncontrol(conn,2);
      Curl_closesocket(conn,conn->sock[sockindex]);
      conn->sock[sockindex] = -1;
    }
    conn->tunnel_state[sockindex] = TUNNEL_INIT;
    if ((conn->bits).proxy_connect_closed == false) {
      uVar20 = (data->req).httpcode;
      pcVar12 = "Received HTTP code %d from proxy after CONNECT";
LAB_0013a2fa:
      Curl_failf(data,pcVar12,(ulong)uVar20);
      return CURLE_RECV_ERROR;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port,
                           bool blocking)
{
  int subversion=0;
  struct Curl_easy *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  time_t check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
      free(data->req.newurl);
      data->req.newurl = NULL;

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        Curl_add_buffer_free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(!result) {
        char *host = NULL;
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        bool ipv6_ip = conn->bits.ipv6_ip;
        char *hostheader;

        /* the hostname may be different */
        if(hostname != conn->host.name)
          ipv6_ip = (strchr(hostname, ':') != NULL);
        hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", ipv6_ip?"[":"", hostname, ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          Curl_add_buffer_free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            Curl_add_buffer_free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host?host:"",
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host)
          free(host);
        free(hostheader);

        if(!result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(!result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(!result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_add_buffer_free(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(!blocking) {
      if(!Curl_conn_data_pending(conn, sockindex))
        /* return so we'll be called again polling-style */
        return CURLE_OK;
      else {
        DEBUGF(infof(data,
               "Read response immediately from proxy CONNECT\n"));
      }
    }

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr = data->state.buffer;
      line_start = ptr;

      nread = 0;
      perline = 0;

      while(nread < BUFSIZE && keepon && !error) {
        int writetype;

        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;

        if(ptr >= &data->state.buffer[BUFSIZE]) {
          failf(data, "CONNECT response too large!");
          return CURLE_RECV_ERROR;
        }

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* Read one byte at a time to avoid a race condition. Wait at most one
           second before looping to ensure continuous pgrsUpdates. */
        result = Curl_read(conn, tunnelsocket, ptr, 1, &gotbytes);
        if(result == CURLE_AGAIN) {
          if(SOCKET_READABLE(tunnelsocket, check<1000L?check:1000) == -1) {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted due to select/poll error");
            break;
          }
          continue;
        }
        else if(result) {
          keepon = FALSE;
          break;
        }
        else if(gotbytes <= 0) {
          if(data->set.proxyauth && data->state.authproxy.avail) {
            /* proxy auth was requested and there was proxy auth available,
               then deem this as "mere" proxy disconnect */
            conn->bits.proxy_connect_closed = TRUE;
            infof(data, "Proxy CONNECT connection closed\n");
          }
          else {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted");
          }
          keepon = FALSE;
          break;
        }

        /* We got a byte of data */
        nread++;

        if(keepon > TRUE) {
          /* This means we are currently ignoring a response-body */

          nread = 0; /* make next read start over in the read buffer */
          ptr = data->state.buffer;
          if(cl) {
            /* A Content-Length based body: simply count down the counter
               and make sure to break out of the loop when we're done! */
            cl--;
            if(cl <= 0) {
              keepon = FALSE;
              break;
            }
          }
          else {
            /* chunked-encoded body, so we need to do the chunked dance
               properly to know when the end of the body is reached */
            CHUNKcode r;
            ssize_t tookcareof = 0;

            /* now parse the chunked piece of data so that we can
               properly tell when the stream ends */
            r = Curl_httpchunk_read(conn, ptr, 1, &tookcareof);
            if(r == CHUNKE_STOP) {
              /* we're done reading chunks! */
              infof(data, "chunk reading DONE\n");
              keepon = FALSE;
              /* we did the full CONNECT treatment, go COMPLETE */
              conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
            }
          }
          continue;
        }

        perline++; /* amount of bytes in this line so far */

        /* if this is not the end of a header line then continue */
        if(*ptr != 0x0a) {
          ptr++;
          continue;
        }

        /* convert from the network encoding */
        result = Curl_convert_from_network(data, line_start, perline);
        /* Curl_convert_from_network calls failf if unsuccessful */
        if(result)
          return result;

        /* output debug if that is requested */
        if(data->set.verbose)
          Curl_debug(data, CURLINFO_HEADER_IN,
                     line_start, (size_t)perline, conn);

        /* send the header to the callback */
        writetype = CLIENTWRITE_HEADER;
        if(data->set.include_header)
          writetype |= CLIENTWRITE_BODY;

        result = Curl_client_write(conn, writetype, line_start, perline);

        data->info.header_size += (long)perline;
        data->req.headerbytecount += (long)perline;

        if(result)
          return result;

        /* Newlines are CRLF, so the CR is ignored as the line isn't
           really terminated until the LF comes. Treat a following CR
           as end-of-headers as well.*/

        if(('\r' == line_start[0]) ||
           ('\n' == line_start[0])) {
          /* end of response-headers from the proxy */
          nread = 0; /* make next read start over in the read
                        buffer */
          ptr = data->state.buffer;
          if((407 == k->httpcode) && !data->state.authproblem) {
            /* If we get a 407 response code with content length
               when we have no auth problem, we must ignore the
               whole response-body */
            keepon = 2;

            if(cl) {
              infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                    " bytes of response-body\n", cl);
            }
            else if(chunked_encoding) {
              CHUNKcode r;

              infof(data, "Ignore chunked response-body\n");

              /* We set ignorebody true here since the chunked
                 decoder function will acknowledge that. Pay
                 attention so that this is cleared again when this
                 function returns! */
              k->ignorebody = TRUE;

              if(line_start[1] == '\n') {
                /* this can only be a LF if the letter at index 0
                   was a CR */
                line_start++;
              }

              /* now parse the chunked piece of data so that we can
                 properly tell when the stream ends */
              r = Curl_httpchunk_read(conn, line_start + 1, 1, &gotbytes);
              if(r == CHUNKE_STOP) {
                /* we're done reading chunks! */
                infof(data, "chunk reading DONE\n");
                keepon = FALSE;
                /* we did the full CONNECT treatment, go to
                   COMPLETE */
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
            }
            else {
              /* without content-length or chunked encoding, we
                 can't keep the connection alive since the close is
                 the end signal so we bail out at once instead */
              keepon = FALSE;
            }
          }
          else
            keepon = FALSE;
          /* we did the full CONNECT treatment, go to COMPLETE */
          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
          continue;
        }

        line_start[perline] = 0; /* zero terminate the buffer */
        if((checkprefix("WWW-Authenticate:", line_start) &&
            (401 == k->httpcode)) ||
           (checkprefix("Proxy-authenticate:", line_start) &&
            (407 == k->httpcode))) {

          bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
          char *auth = Curl_copy_header_value(line_start);
          if(!auth)
            return CURLE_OUT_OF_MEMORY;

          result = Curl_http_input_auth(conn, proxy, auth);

          free(auth);

          if(result)
            return result;
        }
        else if(checkprefix("Content-Length:", line_start)) {
          if(k->httpcode/100 == 2) {
            /* A server MUST NOT send any Transfer-Encoding or
               Content-Length header fields in a 2xx (Successful)
               response to CONNECT. (RFC 7231 section 4.3.6) */
            failf(data, "Content-Length: in %03d response",
                  k->httpcode);
            return CURLE_RECV_ERROR;
          }

          cl = curlx_strtoofft(line_start +
                               strlen("Content-Length:"), NULL, 10);
        }
        else if(Curl_compareheader(line_start, "Connection:", "close"))
          closeConnection = TRUE;
        else if(Curl_compareheader(line_start,
                                   "Transfer-Encoding:",
                                   "chunked")) {
          if(k->httpcode/100 == 2) {
            /* A server MUST NOT send any Transfer-Encoding or
               Content-Length header fields in a 2xx (Successful)
               response to CONNECT. (RFC 7231 section 4.3.6) */
            failf(data, "Transfer-Encoding: in %03d response", k->httpcode);
            return CURLE_RECV_ERROR;
          }
          infof(data, "CONNECT responded chunked\n");
          chunked_encoding = TRUE;
          /* init our chunky engine */
          Curl_httpchunk_init(conn);
        }
        else if(Curl_compareheader(line_start, "Proxy-Connection:", "close"))
          closeConnection = TRUE;
        else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                            &subversion,
                            &k->httpcode)) {
          /* store the HTTP code from the proxy */
          data->info.httpproxycode = k->httpcode;
        }

        perline = 0; /* line starts over here */
        ptr = data->state.buffer;
        line_start = ptr;
      } /* while there's buffer left and loop is requested */

      if(Curl_pgrsUpdate(conn))
        return CURLE_ABORTED_BY_CALLBACK;

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      free(data->req.newurl);
      data->req.newurl = NULL;
      /* failure, close this connection to avoid re-use */
      streamclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    else {
      failf(data, "Received HTTP code %d from proxy after CONNECT",
            data->req.httpcode);
      return CURLE_RECV_ERROR;
    }
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof(data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}